

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkLutmin(Abc_Ntk_t *pNtkInit,int nLutSize,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtk;
  char *__format;
  
  if (nLutSize < 4) {
    __format = "The LUT count (%d) should be at least 4.\n";
  }
  else {
    if ((uint)nLutSize < 7) {
      if (pNtkInit->ntkType == ABC_NTK_STRASH) {
        pAVar5 = Abc_NtkDup(pNtkInit);
      }
      else {
        pAVar5 = Abc_NtkStrash(pNtkInit,0,1,0);
      }
      pNtk = Abc_NtkCollapse(pAVar5,10000,0,1,0,0,0);
      Abc_NtkDelete(pAVar5);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        return (Abc_Ntk_t *)0x0;
      }
      if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
        Abc_NtkToBdd(pNtk);
      }
      iVar2 = Abc_NtkGetFaninMax(pNtk);
      if (nLutSize < iVar2) {
        iVar2 = 0;
        pAVar5 = pNtk;
        do {
          if (fVerbose == 0) {
            pNtk = Abc_NtkLutminInt(pAVar5,nLutSize,0);
          }
          else {
            printf("*** Iteration %d:\n",(ulong)(iVar2 + 1));
            uVar1 = pAVar5->nObjCounts[7];
            uVar3 = Abc_NtkGetFaninMax(pAVar5);
            printf("Decomposing network with %d nodes and %d max fanin count for K = %d.\n",
                   (ulong)uVar1,(ulong)uVar3);
            pNtk = Abc_NtkLutminInt(pAVar5,nLutSize,fVerbose);
          }
          iVar2 = iVar2 + 1;
          Abc_NtkDelete(pAVar5);
          iVar4 = Abc_NtkGetFaninMax(pNtk);
          pAVar5 = pNtk;
        } while (nLutSize < iVar4);
      }
      Abc_NtkLogicMakeSimpleCos(pNtk,0);
      Abc_NtkFraigSweep(pNtk,1,0,0,0);
      iVar2 = Abc_NtkCheck(pNtk);
      if (iVar2 != 0) {
        return pNtk;
      }
      puts("Abc_NtkLutmin: The network check has failed.");
      return (Abc_Ntk_t *)0x0;
    }
    __format = "The LUT count (%d) should not exceed 6.\n";
  }
  printf(__format,nLutSize);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtkInit, int nLutSize, int fVerbose )
{
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtkNew, * pTemp;
    int i;
    if ( nLutSize < 4 )
    {
        printf( "The LUT count (%d) should be at least 4.\n", nLutSize );
        return NULL;
    }
    if ( nLutSize > 6 )
    {
        printf( "The LUT count (%d) should not exceed 6.\n", nLutSize );
        return NULL;
    }
    // create internal representation
    if ( Abc_NtkIsStrash(pNtkInit) )
        pNtkNew = Abc_NtkDup( pNtkInit );
    else
        pNtkNew = Abc_NtkStrash( pNtkInit, 0, 1, 0 );
    // collapse the network 
    pNtkNew = Abc_NtkCollapse( pTemp = pNtkNew, 10000, 0, 1, 0, 0, 0 );
    Abc_NtkDelete( pTemp );
    if ( pNtkNew == NULL )
        return NULL;
    // convert it to BDD
    if ( !Abc_NtkIsBddLogic(pNtkNew) )
        Abc_NtkToBdd( pNtkNew );
    // iterate decomposition
    for ( i = 0; Abc_NtkGetFaninMax(pNtkNew) > nLutSize; i++ )
    {
        if ( fVerbose )
            printf( "*** Iteration %d:\n", i+1 );
        if ( fVerbose )
            printf( "Decomposing network with %d nodes and %d max fanin count for K = %d.\n", 
                Abc_NtkNodeNum(pNtkNew), Abc_NtkGetFaninMax(pNtkNew), nLutSize );
        pNtkNew = Abc_NtkLutminInt( pTemp = pNtkNew, nLutSize, fVerbose );
        Abc_NtkDelete( pTemp );
    }
    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // merge functionally equivalent nodes
    Abc_NtkFraigSweep( pNtkNew, 1, 0, 0, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkLutmin: The network check has failed.\n" );
        return 0;
    }
    return pNtkNew;
}